

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfilters.c
# Opt level: O1

CURLcode Curl_conn_connect(Curl_easy *data,int sockindex,_Bool blocking,_Bool *done)

{
  easy_pollset *ps_00;
  curl_trc_feat *pcVar1;
  connectdata *pcVar2;
  Curl_cft_cntrl *pCVar3;
  _Bool _Var4;
  CURLcode CVar5;
  int iVar6;
  CURLcode CVar7;
  timediff_t tVar8;
  Curl_easy *data_00;
  uint sock;
  Curl_cfilter *pCVar9;
  int i;
  long lVar10;
  bool bVar11;
  curltime cVar12;
  curl_pollfds cpfds;
  easy_pollset ps;
  pollfd a_few_on_stack [5];
  undefined1 local_90 [32];
  connectdata *pcStack_70;
  undefined8 local_68;
  Curl_llist *pCStack_60;
  pollfd local_58 [5];
  
  pCVar9 = data->conn->cfilter[sockindex];
  if (pCVar9 == (Curl_cfilter *)0x0) {
    *done = false;
    CVar5 = CURLE_FAILED_INIT;
  }
  else {
    CVar5 = CURLE_OK;
    _Var4 = (_Bool)(pCVar9->field_0x24 & 1);
    *done = _Var4;
    if (_Var4 == false) {
      Curl_pollfds_init((curl_pollfds *)local_90,local_58,5);
      if (*done == false) {
        ps_00 = (easy_pollset *)(local_90 + 0x18);
LAB_001190f1:
        _Var4 = Curl_conn_needs_flush(data,sockindex);
        if (((_Var4) && (CVar5 = Curl_conn_flush(data,sockindex), CVar5 != CURLE_AGAIN)) &&
           (CVar5 != CURLE_OK)) {
          return CVar5;
        }
        CVar5 = (*(code *)pCVar9->cft->do_connect)(pCVar9,data,done);
        if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)
             ))) && (0 < pCVar9->cft->log_level)) {
          Curl_trc_cf_infof(data,pCVar9,"Curl_conn_connect(block=%d) -> %d, done=%d",(ulong)blocking
                            ,(ulong)CVar5,(ulong)*done);
        }
        if (CVar5 == CURLE_OK) {
          if (*done == true) {
            pcVar2 = data->conn;
            lVar10 = 0;
            do {
              for (pCVar9 = pcVar2->cfilter[lVar10]; pCVar9 != (Curl_cfilter *)0x0;
                  pCVar9 = pCVar9->next) {
                pCVar3 = pCVar9->cft->cntrl;
                if (pCVar3 != Curl_cf_def_cntrl) {
                  (*pCVar3)(pCVar9,data,0x100,0,(void *)0x0);
                }
              }
              bVar11 = lVar10 == 0;
              lVar10 = lVar10 + 1;
            } while (bVar11);
            conn_report_connect_stats(data,data->conn);
            pcVar2 = data->conn;
            cVar12 = Curl_now();
            (pcVar2->keepalive).tv_sec = cVar12.tv_sec;
            (pcVar2->keepalive).tv_usec = cVar12.tv_usec;
            Curl_verboseconnect(data,data->conn,sockindex);
            goto LAB_001190af;
          }
          if (!blocking) goto LAB_001190af;
          tVar8 = Curl_timeleft(data,(curltime *)0x0,true);
          CVar5 = (*pCVar9->cft->query)(pCVar9,data,3,(int *)0x0,ps_00);
          if (tVar8 < 0) {
            Curl_failf(data,"connect timeout");
            CVar5 = CURLE_OPERATION_TIMEDOUT;
            CVar7 = CURLE_FTP_ACCEPT_TIMEOUT;
          }
          else {
            sock = -(uint)(CVar5 != CURLE_OK) | local_90._24_4_;
            if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
               (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar1->log_level)) && (0 < pCVar9->cft->log_level)))) {
              Curl_trc_cf_infof(data,pCVar9,"Curl_conn_connect(block=1), do poll");
            }
            data_00 = (Curl_easy *)local_90;
            Curl_pollfds_reset((curl_pollfds *)data_00);
            local_68._0_4_ = MSTATE_INIT;
            local_68._4_4_ = CURLE_OK;
            pCStack_60 = (Curl_llist *)0x0;
            local_90._24_8_ = (multi_sub_xfer_done_cb *)0x0;
            pcStack_70 = (connectdata *)0x0;
            if (sock != 0xffffffff) {
              Curl_pollset_change(data_00,ps_00,sock,2,1);
            }
            pcVar2 = data->conn;
            lVar10 = 0;
            do {
              Curl_conn_cf_adjust_pollset(pcVar2->cfilter[lVar10],data,ps_00);
              lVar10 = lVar10 + 1;
            } while (lVar10 == 1);
            CVar5 = Curl_pollfds_add_ps((curl_pollfds *)local_90,ps_00);
            if (CVar5 == CURLE_OK) {
              lVar10 = 1000;
              if (local_90._8_4_ == 0) {
                lVar10 = 10;
              }
              if (tVar8 < lVar10) {
                lVar10 = tVar8;
              }
              iVar6 = Curl_poll((pollfd *)local_90._0_8_,local_90._8_4_,lVar10);
              if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
                  ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                   (0 < pcVar1->log_level)))) && (0 < pCVar9->cft->log_level)) {
                Curl_trc_cf_infof(data,pCVar9,"Curl_conn_connect(block=1), Curl_poll() -> %d");
              }
              CVar7 = iVar6 >> 0x1f & CURLE_FTP_ACCEPT_TIMEOUT;
              CVar5 = iVar6 >> 0x1f & CURLE_COULDNT_CONNECT;
            }
            else {
              CVar7 = CURLE_FTP_ACCEPT_TIMEOUT;
            }
          }
          if (CVar7 == CURLE_OK) goto code_r0x00119327;
          if (CVar7 != CURLE_FTP_ACCEPT_TIMEOUT) {
            return CVar5;
          }
        }
        else {
          if (((data != (Curl_easy *)0x0) && (((data->set).field_0x89f & 0x40) != 0)) &&
             (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
               (0 < pcVar1->log_level)) && (0 < pCVar9->cft->log_level)))) {
            Curl_trc_cf_infof(data,pCVar9,"Curl_conn_connect(), filter returned %d",(ulong)CVar5);
          }
          conn_report_connect_stats(data,data->conn);
        }
        goto LAB_001190b2;
      }
LAB_001190af:
      CVar5 = CURLE_OK;
LAB_001190b2:
      Curl_pollfds_cleanup((curl_pollfds *)local_90);
    }
  }
  return CVar5;
code_r0x00119327:
  if (*done != false) goto LAB_001190b2;
  goto LAB_001190f1;
}

Assistant:

CURLcode Curl_conn_connect(struct Curl_easy *data,
                           int sockindex,
                           bool blocking,
                           bool *done)
{
#define CF_CONN_NUM_POLLS_ON_STACK 5
  struct pollfd a_few_on_stack[CF_CONN_NUM_POLLS_ON_STACK];
  struct curl_pollfds cpfds;
  struct Curl_cfilter *cf;
  CURLcode result = CURLE_OK;

  DEBUGASSERT(data);
  DEBUGASSERT(data->conn);

  cf = data->conn->cfilter[sockindex];
  if(!cf) {
    *done = FALSE;
    return CURLE_FAILED_INIT;
  }

  *done = cf->connected;
  if(*done)
    return CURLE_OK;

  Curl_pollfds_init(&cpfds, a_few_on_stack, CF_CONN_NUM_POLLS_ON_STACK);
  while(!*done) {
    if(Curl_conn_needs_flush(data, sockindex)) {
      DEBUGF(infof(data, "Curl_conn_connect(index=%d), flush", sockindex));
      result = Curl_conn_flush(data, sockindex);
      if(result && (result != CURLE_AGAIN))
        return result;
    }

    result = cf->cft->do_connect(cf, data, done);
    CURL_TRC_CF(data, cf, "Curl_conn_connect(block=%d) -> %d, done=%d",
                blocking, result, *done);
    if(!result && *done) {
      /* Now that the complete filter chain is connected, let all filters
       * persist information at the connection. E.g. cf-socket sets the
       * socket and ip related information. */
      cf_cntrl_update_info(data, data->conn);
      conn_report_connect_stats(data, data->conn);
      data->conn->keepalive = Curl_now();
      Curl_verboseconnect(data, data->conn, sockindex);
      goto out;
    }
    else if(result) {
      CURL_TRC_CF(data, cf, "Curl_conn_connect(), filter returned %d",
                  result);
      conn_report_connect_stats(data, data->conn);
      goto out;
    }

    if(!blocking)
      goto out;
    else {
      /* check allowed time left */
      const timediff_t timeout_ms = Curl_timeleft(data, NULL, TRUE);
      curl_socket_t sockfd = Curl_conn_cf_get_socket(cf, data);
      struct easy_pollset ps;
      int rc;

      if(timeout_ms < 0) {
        /* no need to continue if time already is up */
        failf(data, "connect timeout");
        result = CURLE_OPERATION_TIMEDOUT;
        goto out;
      }

      CURL_TRC_CF(data, cf, "Curl_conn_connect(block=1), do poll");
      Curl_pollfds_reset(&cpfds);
      memset(&ps, 0, sizeof(ps));
      /* In general, we want to send after connect, wait on that. */
      if(sockfd != CURL_SOCKET_BAD)
        Curl_pollset_set_out_only(data, &ps, sockfd);
      Curl_conn_adjust_pollset(data, data->conn, &ps);
      result = Curl_pollfds_add_ps(&cpfds, &ps);
      if(result)
        goto out;

      rc = Curl_poll(cpfds.pfds, cpfds.n,
                     CURLMIN(timeout_ms, (cpfds.n ? 1000 : 10)));
      CURL_TRC_CF(data, cf, "Curl_conn_connect(block=1), Curl_poll() -> %d",
                  rc);
      if(rc < 0) {
        result = CURLE_COULDNT_CONNECT;
        goto out;
      }
      /* continue iterating */
    }
  }

out:
  Curl_pollfds_cleanup(&cpfds);
  return result;
}